

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalUnixMakefileGenerator3>::GetGeneratorNames_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,
          cmGlobalGeneratorSimpleFactory<cmGlobalUnixMakefileGenerator3> *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  cmGlobalUnixMakefileGenerator3::GetActualName_abi_cxx11_();
  __l._M_len = 1;
  __l._M_array = &local_30;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,__l,&local_31);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> GetGeneratorNames() const override
  {
    return { T::GetActualName() };
  }